

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_keys_values.cpp
# Opt level: O1

void duckdb::MapKeyValueFunction
               (DataChunk *args,ExpressionState *state,Vector *result,
               _func_Vector_ptr_Vector_ptr *get_child_vector)

{
  UnifiedVectorFormat *pUVar1;
  char cVar2;
  reference pvVar3;
  Vector *pVVar4;
  ulong uVar5;
  UnifiedVectorFormat map_data;
  Vector child;
  ulong local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> local_c0;
  undefined8 local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  Vector local_90 [8];
  LogicalType local_88 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  pvVar3 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  if (pvVar3[8] == (value_type)0x1) {
    duckdb::Vector::SetVectorType((VectorType)state);
    duckdb::ConstantVector::SetNull((Vector *)state,true);
    return;
  }
  pUVar1 = *(UnifiedVectorFormat **)(args + 0x18);
  pVVar4 = (Vector *)(*(code *)result)(pvVar3);
  duckdb::Vector::Vector(local_90,pVVar4);
  pVVar4 = (Vector *)duckdb::ListVector::GetEntry((Vector *)state);
  duckdb::Vector::Reference(pVVar4);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_d8);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar3,pUVar1);
  *(undefined8 *)(state + 0x20) = local_d0;
  FlatVector::VerifyFlatVector((Vector *)state);
  *(undefined8 *)(state + 0x28) = local_c8;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(state + 0x30),
             &local_c0);
  *(undefined8 *)(state + 0x40) = local_b0;
  uVar5 = duckdb::ListVector::GetListSize(pvVar3);
  duckdb::ListVector::SetListSize((Vector *)state,uVar5);
  if (*pvVar3 == (value_type)0x3) {
    duckdb::Vector::Slice((SelectionVector *)state,local_d8);
  }
  cVar2 = duckdb::DataChunk::AllConstant();
  if (cVar2 != '\0') {
    duckdb::Vector::SetVectorType((VectorType)state);
  }
  duckdb::Vector::Verify((ulong)state);
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  if (local_c0.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  duckdb::LogicalType::~LogicalType(local_88);
  return;
}

Assistant:

static void MapKeyValueFunction(DataChunk &args, ExpressionState &state, Vector &result,
                                Vector &(*get_child_vector)(Vector &)) {
	auto &map = args.data[0];

	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);
	if (map.GetType().id() == LogicalTypeId::SQLNULL) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		return;
	}

	auto count = args.size();
	D_ASSERT(map.GetType().id() == LogicalTypeId::MAP);
	auto child = get_child_vector(map);

	auto &entries = ListVector::GetEntry(result);
	entries.Reference(child);

	UnifiedVectorFormat map_data;
	map.ToUnifiedFormat(count, map_data);

	D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
	FlatVector::SetData(result, map_data.data);
	FlatVector::SetValidity(result, map_data.validity);
	auto list_size = ListVector::GetListSize(map);
	ListVector::SetListSize(result, list_size);
	if (map.GetVectorType() == VectorType::DICTIONARY_VECTOR) {
		result.Slice(*map_data.sel, count);
	}
	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	result.Verify(count);
}